

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
::write_double<long_double>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
           *this,longdouble value,format_specs *spec)

{
  bool bVar1;
  alignment aVar2;
  int iVar3;
  value_type *pvVar4;
  align_spec *in_RSI;
  longdouble in_stack_00000008;
  truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  bool use_grisu;
  memory_buffer buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler handler;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffcbc;
  undefined4 uVar6;
  int iVar7;
  undefined2 uVar8;
  undefined5 in_stack_fffffffffffffcc2;
  char in_stack_fffffffffffffcc7;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  write_inf_or_nan_t *in_stack_fffffffffffffcd0;
  undefined2 in_stack_fffffffffffffcd8;
  char local_309;
  buffer *in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd11;
  undefined2 in_stack_fffffffffffffd18;
  core_format_specs in_stack_fffffffffffffd20;
  allocator<char> local_261;
  basic_buffer<char> local_260 [4];
  double_writer *in_stack_fffffffffffffe20;
  align_spec *in_stack_fffffffffffffe28;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *in_stack_fffffffffffffe30;
  char local_23;
  float_spec_handler local_22;
  align_spec *local_20;
  longdouble local_18;
  
  local_18 = in_stack_00000008;
  local_20 = in_RSI;
  float_spec_handler::float_spec_handler(&local_22,*(char *)((long)&in_RSI[1].fill_ + 1));
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>
            (in_stack_fffffffffffffcc7,
             (float_spec_handler *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  local_23 = '\0';
  bVar1 = std::signbit(local_18);
  if (bVar1) {
    local_23 = '-';
    local_18 = -local_18;
  }
  else {
    bVar1 = core_format_specs::has((core_format_specs *)(local_20 + 1),1);
    if (bVar1) {
      bVar1 = core_format_specs::has((core_format_specs *)(local_20 + 1),2);
      local_309 = '+';
      if (!bVar1) {
        local_309 = ' ';
      }
      local_23 = local_309;
    }
  }
  bVar1 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<long_double>
                    ((longdouble)CONCAT28(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0));
  if (bVar1) {
    write_double<long_double>::write_inf_or_nan_t::operator()
              (in_stack_fffffffffffffcd0,
               (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  }
  else {
    uVar5 = SUB104(local_18,0);
    uVar6 = (undefined4)((unkuint10)local_18 >> 0x20);
    uVar8 = (undefined2)((unkuint10)local_18 >> 0x40);
    bVar1 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<long_double>
                      ((longdouble)CONCAT28(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0));
    if (bVar1) {
      write_double<long_double>::write_inf_or_nan_t::operator()
                (in_stack_fffffffffffffcd0,
                 (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    }
    else {
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcc7,CONCAT52(in_stack_fffffffffffffcc2,uVar8)),
                 (allocator<char> *)CONCAT44(uVar6,uVar5));
      std::allocator<char>::~allocator(&local_261);
      uVar5 = SUB104(local_18,0);
      iVar7 = (int)((unkuint10)local_18 >> 0x20);
      uVar8 = (undefined2)((unkuint10)local_18 >> 0x40);
      internal::sprintf_format<long_double>
                ((longdouble)
                 CONCAT28(in_stack_fffffffffffffd18,
                          CONCAT71(in_stack_fffffffffffffd11,in_stack_fffffffffffffd10)),
                 in_stack_fffffffffffffd08,in_stack_fffffffffffffd20);
      internal::basic_buffer<char>::size(local_260);
      aVar2 = align_spec::align(local_20);
      if (aVar2 == ALIGN_NUMERIC) {
        if (local_23 != '\0') {
          reserve((basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
                   *)CONCAT17(in_stack_fffffffffffffcc7,CONCAT52(in_stack_fffffffffffffcc2,uVar8)),
                  CONCAT44(iVar7,uVar5));
          iVar3 = (int)local_23;
          internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>::operator++
                    ((truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *)
                     CONCAT17(in_stack_fffffffffffffcc7,CONCAT52(in_stack_fffffffffffffcc2,uVar8)),
                     iVar7);
          pvVar4 = internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>::
                   operator*((truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *
                             )&stack0xfffffffffffffd20);
          *pvVar4 = iVar3;
        }
      }
      else {
        align_spec::align(local_20);
      }
      basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
      ::
      write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>::double_writer>
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcc7,CONCAT52(in_stack_fffffffffffffcc2,uVar8)));
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}